

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderAllowDropNullTestissue178::runTestCase(TestCharReaderAllowDropNullTestissue178 *this)

{
  TestResult *pTVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  Value *pVVar6;
  CharReader *pCVar7;
  allocator local_211;
  char doc_2 [3];
  undefined1 uStack_20a;
  undefined4 uStack_20c;
  undefined1 uStack_209;
  undefined1 local_208 [32];
  char doc [16];
  string local_1d0;
  string errs;
  Value root;
  CharReaderBuilder b;
  Value local_138;
  Value local_110;
  Value local_e8;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  Json::CharReaderBuilder::CharReaderBuilder(&b);
  Json::Value::Value(&local_48,true);
  pVVar6 = Json::Value::operator[](&b.settings_,"allowDroppedNullPlaceholders");
  Json::Value::operator=(pVVar6,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&root,nullValue);
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  pCVar7 = Json::CharReaderBuilder::newCharReader(&b);
  builtin_strncpy(doc,"{\"a\":,\"b\":true}",0x10);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 0xf,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x7fb,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7fc,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,2,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7fd,"2u == root.size()");
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  Json::Value::Value((Value *)doc_2,true);
  Json::Value::get(&local_70,&root,"a",(Value *)doc_2);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar1,nullValue,&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7fe,"Json::nullValue == root.get(\"a\", true)");
  Json::Value::~Value(&local_70);
  Json::Value::~Value((Value *)doc_2);
  builtin_strncpy(doc,"{\"a\":}",7);
  uVar2 = doc._0_4_;
  doc._0_8_ = CONCAT44(doc._4_4_,uVar2);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 6,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x805,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x806,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,1,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x807,"1u == root.size()");
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  Json::Value::Value((Value *)doc_2,true);
  Json::Value::get(&local_98,&root,"a",(Value *)doc_2);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar1,nullValue,&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x808,"Json::nullValue == root.get(\"a\", true)");
  Json::Value::~Value(&local_98);
  Json::Value::~Value((Value *)doc_2);
  stack0xfffffffffffffdf2 = (uint6)((ulong)_doc_2 >> 0x10) & 0xffffffffff00;
  doc_2[0] = '[';
  doc_2[1] = ']';
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc_2,doc_2 + 2,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x80f,"ok");
  }
  bVar3 = std::operator==(&errs,"");
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x810,"errs == \"\"");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,0,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x811,"0u == root.size()");
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  Json::Value::Value(&local_c0,&root);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar1,arrayValue,&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x812,"Json::arrayValue == root");
  Json::Value::~Value(&local_c0);
  _doc_2 = 0x5d6c6c000000;
  _doc_2 = 0x6c756e5b;
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc_2,&uStack_20a,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x819,"ok");
  }
  bVar3 = std::operator==(&errs,"");
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x81a,"errs == \"\"");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,1,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x81b,"1u == root.size()");
  builtin_strncpy(doc,"[,]",4);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 3,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x822,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x823,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,2,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x824,"2u == root.size()");
  builtin_strncpy(doc,"[,,,]",6);
  uVar2 = doc._0_4_;
  doc._0_8_ = CONCAT44(doc._4_4_,uVar2);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 5,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x82b,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x82c,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,4,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x82d,"4u == root.size()");
  builtin_strncpy(doc,"[null,]",8);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 7,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x834,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x835,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,2,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x836,"2u == root.size()");
  _doc_2 = 6.546952731366453e-307;
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc_2,&uStack_209,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x83d,"ok");
  }
  bVar3 = std::operator==(&errs,"");
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x83e,"errs == \"\"");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,2,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x83f,"2u == root.size()");
  doc._4_4_ = SUB84(doc._0_8_,4) & 0xffffff00;
  builtin_strncpy(doc,"[,,]",4);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 4,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x846,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x847,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,3,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x848,"3u == root.size()");
  builtin_strncpy(doc,"[null,,]",8);
  doc._8_4_ = doc._8_4_ & 0xffffff00;
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 8,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x84f,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x850,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,3,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x851,"3u == root.size()");
  builtin_strncpy(doc,"[,null,]",8);
  doc._8_4_ = doc._8_4_ & 0xffffff00;
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 8,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x858,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x859,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,3,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x85a,"3u == root.size()");
  _doc_2 = (pointer)0x5d6c6c756e2c2c5b;
  local_208[0] = 0;
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc_2,local_208,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x861,"ok");
  }
  bVar3 = std::operator==(&errs,"");
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x862,"errs == \"\"");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,3,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x863,"3u == root.size()");
  builtin_strncpy(doc,"[[],,,]",8);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 7,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x86a,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x86b,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,4,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x86c,"4u == root.size()");
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  pVVar6 = Json::Value::operator[](&root,0);
  Json::Value::Value(&local_e8,pVVar6);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar1,arrayValue,&local_e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x86d,"Json::arrayValue == root[0u]");
  Json::Value::~Value(&local_e8);
  builtin_strncpy(doc,"[,[],,]",8);
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc,doc + 7,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x874,"ok");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)doc_2,"",&local_211);
  std::__cxx11::string::string((string *)&local_1d0,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,(string *)doc_2,&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x875,"\"\" == errs");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)doc_2);
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,4,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x876,"4u == root.size()");
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  pVVar6 = Json::Value::operator[](&root,1);
  Json::Value::Value(&local_110,pVVar6);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar1,arrayValue,&local_110,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x877,"Json::arrayValue == root[1u]");
  Json::Value::~Value(&local_110);
  _doc_2 = 6.533856499361437e-307;
  iVar4 = (*pCVar7->_vptr_CharReader[2])(pCVar7,doc_2,&uStack_209,&root,&errs);
  if ((char)iVar4 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x87e,"ok");
  }
  bVar3 = std::operator==(&errs,"");
  if (!bVar3) {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderAllowDropNullTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x87f,"errs == \"\"");
  }
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  AVar5 = Json::Value::size(&root);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (pTVar1,4,AVar5,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x880,"4u == root.size()");
  pTVar1 = (this->super_CharReaderAllowDropNullTest).super_TestCase.result_;
  pVVar6 = Json::Value::operator[](&root,3);
  Json::Value::Value(&local_138,pVVar6);
  JsonTest::checkEqual<Json::ValueType,Json::Value>
            (pTVar1,arrayValue,&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x881,"Json::arrayValue == root[3u]");
  Json::Value::~Value(&local_138);
  (*pCVar7->_vptr_CharReader[1])(pCVar7);
  std::__cxx11::string::~string((string *)&errs);
  Json::Value::~Value(&root);
  Json::CharReaderBuilder::~CharReaderBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderAllowDropNullTest, issue178) {
  Json::CharReaderBuilder b;
  b.settings_["allowDroppedNullPlaceholders"] = true;
  Json::Value root;
  std::string errs;
  Json::CharReader* reader(b.newCharReader());
  {
    char const doc[] = "{\"a\":,\"b\":true}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::nullValue, root.get("a", true));
  }
  {
    char const doc[] = "{\"a\":}";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(1u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::nullValue, root.get("a", true));
  }
  {
    char const doc[] = "[]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(0u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root);
  }
  {
    char const doc[] = "[null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(1u, root.size());
  }
  {
    char const doc[] = "[,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
  }
  {
    char const doc[] = "[null,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(2u, root.size());
  }
  {
    char const doc[] = "[,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[null,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[,null,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[,,null]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(3u, root.size());
  }
  {
    char const doc[] = "[[],,,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[0u]);
  }
  {
    char const doc[] = "[,[],,]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT_STRING_EQUAL("", errs);
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[1u]);
  }
  {
    char const doc[] = "[,,,[]]";
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(ok);
    JSONTEST_ASSERT(errs == "");
    JSONTEST_ASSERT_EQUAL(4u, root.size());
    JSONTEST_ASSERT_EQUAL(Json::arrayValue, root[3u]);
  }
  delete reader;
}